

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_error.cpp
# Opt level: O0

char * anon_unknown.dwarf_1ab29::error_enum_name(int err)

{
  char *pcStack_10;
  int err_local;
  
  if (err == 9) {
    pcStack_10 = "EBADF";
  }
  else if (err == 0xb) {
    pcStack_10 = "EAGAIN";
  }
  else if (err == 0xd) {
    pcStack_10 = "EACCES";
  }
  else if (err == 0x16) {
    pcStack_10 = "EINVAL";
  }
  else if (err == 0x18) {
    pcStack_10 = "EMFILE";
  }
  else if (err == 0x20) {
    pcStack_10 = "EPIPE";
  }
  else if (err == 0x62) {
    pcStack_10 = "EADDRINUSE";
  }
  else if (err == 99) {
    pcStack_10 = "EADDRNOTAVAIL";
  }
  else if (err == 0x68) {
    pcStack_10 = "ECONNRESET";
  }
  else if (err == 0x6f) {
    pcStack_10 = "ECONNREFUSED";
  }
  else {
    pcStack_10 = "<unknown error>";
  }
  return pcStack_10;
}

Assistant:

char const* error_enum_name(int err)
    {
        switch (err)
        {
        case EBADF:
            return "EBADF";
        case EAGAIN:
            return "EAGAIN";
        case EACCES:
            return "EACCES";
        case EINVAL:
            return "EINVAL";
        case EMFILE:
            return "EMFILE";
        case EPIPE:
            return "EPIPE";
        case EADDRINUSE:
            return "EADDRINUSE";
        case EADDRNOTAVAIL:
            return "EADDRNOTAVAIL";
        case ECONNRESET:
            return "ECONNRESET";
        case ECONNREFUSED:
            return "ECONNREFUSED";
        }

        return "<unknown error>";
    }